

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-writable-after-shutdown.c
# Opt level: O0

int run_test_not_writable_after_shutdown(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_connect_t connect_req;
  uv_tcp_t socket;
  uv_loop_t *loop;
  sockaddr_in addr;
  int r;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(long)&loop + 4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
            ,0x34,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  loop_00 = (uv_loop_t *)uv_default_loop();
  addr.sin_zero._0_4_ = uv_tcp_init(loop_00,&connect_req.queue.prev);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
            ,0x38,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  addr.sin_zero._0_4_ = uv_tcp_connect(&eval_a,&connect_req.queue.prev,(long)&loop + 4,connect_cb);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
            ,0x3e,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  addr.sin_zero._0_4_ = uv_run(loop_00,0);
  if ((long)(int)addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
            ,0x41,"r","==","0",(long)(int)addr.sin_zero._0_4_,"==",0);
    abort();
  }
  close_loop(loop_00);
  iVar1 = uv_loop_close(loop_00);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-not-writable-after-shutdown.c"
            ,0x43,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(not_writable_after_shutdown) {
  int r;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_tcp_t socket;
  uv_connect_t connect_req;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_tcp_init(loop, &socket);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &socket,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}